

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O0

aiNode * __thiscall
Assimp::BlenderImporter::ConvertNode
          (BlenderImporter *this,Scene *in,Object *obj,ConversionData *conv_data,
          aiMatrix4x4 *parentTransform)

{
  float fVar1;
  Object *obj_00;
  BlenderModifierShowcase *this_00;
  bool bVar2;
  uint uVar3;
  reference ppOVar4;
  _Self __position;
  aiNode *paVar5;
  mywrap *pmVar6;
  Mesh *mesh_00;
  uint *puVar7;
  Lamp *lamp;
  mywrap *this_01;
  element_type *peVar8;
  Camera *cam;
  mywrap *this_02;
  pointer paVar9;
  float *pfVar10;
  aiMatrix4x4t<float> *paVar11;
  size_type sVar12;
  reference ppOVar13;
  type out;
  ulong __n;
  aiMatrix4x4t<float> local_230;
  Object *local_1f0;
  Object *nobj;
  iterator __end2;
  iterator __begin2;
  deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_> *__range2
  ;
  aiNode **nd;
  undefined1 auStack_158 [8];
  aiMatrix4x4 m;
  uint local_110;
  uint local_10c;
  uint y;
  uint x;
  aiCamera *mesh_1;
  aiLight *mesh;
  int iStack_f0;
  uint i;
  size_t old;
  string local_e0;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> local_c0;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> node;
  Object *local_98;
  Object *object;
  _Self local_88;
  iterator it;
  deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_> children;
  aiMatrix4x4 *parentTransform_local;
  ConversionData *conv_data_local;
  Object *obj_local;
  Scene *in_local;
  BlenderImporter *this_local;
  
  std::deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
  deque((deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_> *)
        &it);
  local_88._M_node =
       (_Base_ptr)
       std::
       set<const_Assimp::Blender::Object_*,_Assimp::Blender::ObjectCompare,_std::allocator<const_Assimp::Blender::Object_*>_>
       ::begin(&conv_data->objects);
  while( true ) {
    object = (Object *)
             std::
             set<const_Assimp::Blender::Object_*,_Assimp::Blender::ObjectCompare,_std::allocator<const_Assimp::Blender::Object_*>_>
             ::end(&conv_data->objects);
    bVar2 = std::operator!=(&local_88,(_Self *)&object);
    if (!bVar2) break;
    ppOVar4 = std::_Rb_tree_const_iterator<const_Assimp::Blender::Object_*>::operator*(&local_88);
    local_98 = *ppOVar4;
    if (local_98->parent == obj) {
      std::deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
      ::push_back((deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
                   *)&it,&local_98);
      __position = std::_Rb_tree_const_iterator<const_Assimp::Blender::Object_*>::operator++
                             (&local_88,0);
      node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
           (__uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true>)
           std::
           set<Assimp::Blender::Object_const*,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
           ::erase_abi_cxx11_((set<Assimp::Blender::Object_const*,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
                               *)conv_data,(const_iterator)__position._M_node);
    }
    else {
      std::_Rb_tree_const_iterator<const_Assimp::Blender::Object_*>::operator++(&local_88);
    }
  }
  paVar5 = (aiNode *)operator_new(0x478);
  old._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,(obj->id).name + 2,(allocator<char> *)((long)&old + 7));
  aiNode::aiNode(paVar5,&local_e0);
  old._6_1_ = 0;
  std::unique_ptr<aiNode,std::default_delete<aiNode>>::unique_ptr<std::default_delete<aiNode>,void>
            ((unique_ptr<aiNode,std::default_delete<aiNode>> *)&local_c0,paVar5);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&old + 7));
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&obj->data);
  if (bVar2) {
    switch(obj->type) {
    case Type_EMPTY:
      break;
    case Type_MESH:
      pmVar6 = Blender::TempArray<std::vector,_aiMesh>::operator->(&conv_data->meshes);
      _iStack_f0 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(pmVar6);
      peVar8 = std::__shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(obj->data).
                           super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>
                         );
      CheckActualType(peVar8,"Mesh");
      mesh_00 = (Mesh *)std::__shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>::
                        get(&(obj->data).
                             super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>
                           );
      ConvertMesh(this,in,obj,mesh_00,conv_data,&conv_data->meshes);
      pmVar6 = Blender::TempArray<std::vector,_aiMesh>::operator->(&conv_data->meshes);
      sVar12 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(pmVar6);
      if (_iStack_f0 < sVar12) {
        pmVar6 = Blender::TempArray<std::vector,_aiMesh>::operator->(&conv_data->meshes);
        sVar12 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(pmVar6);
        uVar3 = (int)sVar12 - iStack_f0;
        paVar9 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_c0);
        paVar9->mNumMeshes = uVar3;
        puVar7 = (uint *)operator_new__((ulong)uVar3 << 2);
        paVar9 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_c0);
        paVar9->mMeshes = puVar7;
        for (mesh._4_4_ = 0; uVar3 = mesh._4_4_,
            paVar9 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_c0),
            uVar3 < paVar9->mNumMeshes; mesh._4_4_ = mesh._4_4_ + 1) {
          uVar3 = mesh._4_4_ + (int)_iStack_f0;
          paVar9 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_c0);
          paVar9->mMeshes[mesh._4_4_] = uVar3;
        }
      }
      break;
    case Type_CURVE:
      NotSupportedObjectType(obj,"Curve");
      break;
    case Type_SURF:
      NotSupportedObjectType(obj,"Surface");
      break;
    case Type_FONT:
      NotSupportedObjectType(obj,"Font");
      break;
    case Type_MBALL:
      NotSupportedObjectType(obj,"MetaBall");
      break;
    default:
      break;
    case Type_LAMP:
      peVar8 = std::__shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(obj->data).
                           super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>
                         );
      CheckActualType(peVar8,"Lamp");
      lamp = (Lamp *)std::__shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>::get
                               (&(obj->data).
                                 super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>
                               );
      mesh_1 = (aiCamera *)ConvertLight(this,in,obj,lamp,conv_data);
      if ((aiLight *)mesh_1 != (aiLight *)0x0) {
        this_01 = Blender::TempArray<std::vector,_aiLight>::operator->(&conv_data->lights);
        std::vector<aiLight_*,_std::allocator<aiLight_*>_>::push_back(this_01,(value_type *)&mesh_1)
        ;
      }
      break;
    case Type_CAMERA:
      peVar8 = std::__shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(obj->data).
                           super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>
                         );
      CheckActualType(peVar8,"Camera");
      cam = (Camera *)
            std::__shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>::get
                      (&(obj->data).
                        super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>);
      _y = ConvertCamera(this,in,obj,cam,conv_data);
      if (_y != (aiCamera *)0x0) {
        this_02 = Blender::TempArray<std::vector,_aiCamera>::operator->(&conv_data->cameras);
        std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::push_back(this_02,(value_type *)&y);
      }
      break;
    case Type_WAVE:
      NotSupportedObjectType(obj,"Wave");
      break;
    case Type_LATTICE:
      NotSupportedObjectType(obj,"Lattice");
    }
  }
  for (local_10c = 0; local_10c < 4; local_10c = local_10c + 1) {
    for (local_110 = 0; local_110 < 4; local_110 = local_110 + 1) {
      fVar1 = obj->obmat[local_10c][local_110];
      paVar9 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_c0);
      pfVar10 = aiMatrix4x4t<float>::operator[](&paVar9->mTransformation,local_110);
      pfVar10[local_10c] = fVar1;
    }
  }
  auStack_158._0_4_ = parentTransform->a1;
  auStack_158._4_4_ = parentTransform->a2;
  m.a1 = parentTransform->a3;
  m.a2 = parentTransform->a4;
  m.a3 = parentTransform->b1;
  m.a4 = parentTransform->b2;
  m.b1 = parentTransform->b3;
  m.b2 = parentTransform->b4;
  m.b3 = parentTransform->c1;
  m.b4 = parentTransform->c2;
  m.c1 = parentTransform->c3;
  m.c2 = parentTransform->c4;
  m.c3 = parentTransform->d1;
  m.c4 = parentTransform->d2;
  m.d1 = parentTransform->d3;
  m.d2 = parentTransform->d4;
  paVar11 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)auStack_158);
  auStack_158._0_4_ = paVar11->a1;
  auStack_158._4_4_ = paVar11->a2;
  m.a1 = paVar11->a3;
  m.a2 = paVar11->a4;
  m.a3 = paVar11->b1;
  m.a4 = paVar11->b2;
  m.b1 = paVar11->b3;
  m.b2 = paVar11->b4;
  m.b3 = paVar11->c1;
  m.b4 = paVar11->c2;
  m.c1 = paVar11->c3;
  m.c2 = paVar11->c4;
  m.c3 = paVar11->d1;
  m.c4 = paVar11->d2;
  m.d1 = paVar11->d3;
  m.d2 = paVar11->d4;
  paVar9 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_c0);
  aiMatrix4x4t<float>::operator*
            ((aiMatrix4x4t<float> *)&nd,(aiMatrix4x4t<float> *)auStack_158,&paVar9->mTransformation)
  ;
  paVar9 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_c0);
  memcpy(&paVar9->mTransformation,&nd,0x40);
  sVar12 = std::
           deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
           ::size((deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
                   *)&it);
  if (sVar12 != 0) {
    sVar12 = std::
             deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
             ::size((deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
                     *)&it);
    paVar9 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_c0);
    paVar9->mNumChildren = (uint)sVar12;
    paVar9 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_c0);
    __n = (ulong)paVar9->mNumChildren << 3;
    __range2 = (deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
                *)operator_new__(__n);
    memset(__range2,0,__n);
    paVar9 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_c0);
    paVar9->mChildren = (aiNode **)__range2;
    std::deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
    begin((iterator *)&__end2._M_node,
          (deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
           *)&it);
    std::deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
    end((iterator *)&nobj,
        (deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_> *)
        &it);
    while (bVar2 = std::operator!=((_Self *)&__end2._M_node,(_Self *)&nobj), bVar2) {
      ppOVar13 = std::
                 _Deque_iterator<const_Assimp::Blender::Object_*,_const_Assimp::Blender::Object_*&,_const_Assimp::Blender::Object_**>
                 ::operator*((_Deque_iterator<const_Assimp::Blender::Object_*,_const_Assimp::Blender::Object_*&,_const_Assimp::Blender::Object_**>
                              *)&__end2._M_node);
      obj_00 = *ppOVar13;
      local_1f0 = obj_00;
      paVar9 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_c0);
      aiMatrix4x4t<float>::operator*(&local_230,&paVar9->mTransformation,parentTransform);
      paVar5 = ConvertNode(this,in,obj_00,conv_data,&local_230);
      (__range2->
      super__Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
      )._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)paVar5;
      paVar9 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::get(&local_c0);
      (__range2->
      super__Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
      )._M_impl.super__Deque_impl_data._M_map[0x89] = (Object **)paVar9;
      std::
      _Deque_iterator<const_Assimp::Blender::Object_*,_const_Assimp::Blender::Object_*&,_const_Assimp::Blender::Object_**>
      ::operator++((_Deque_iterator<const_Assimp::Blender::Object_*,_const_Assimp::Blender::Object_*&,_const_Assimp::Blender::Object_**>
                    *)&__end2._M_node);
      __range2 = (deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
                  *)&(__range2->
                     super__Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
                     )._M_impl.super__Deque_impl_data._M_map_size;
    }
  }
  this_00 = this->modifier_cache;
  out = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator*(&local_c0);
  Blender::BlenderModifierShowcase::ApplyModifiers(this_00,out,conv_data,in,obj);
  paVar9 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::release(&local_c0);
  std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr(&local_c0);
  std::deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
  ~deque((deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_> *
         )&it);
  return paVar9;
}

Assistant:

aiNode* BlenderImporter::ConvertNode(const Scene& in, const Object* obj, ConversionData& conv_data, const aiMatrix4x4& parentTransform)
{
    std::deque<const Object*> children;
    for(ObjectSet::iterator it = conv_data.objects.begin(); it != conv_data.objects.end() ;) {
        const Object* object = *it;
        if (object->parent == obj) {
            children.push_back(object);

            conv_data.objects.erase(it++);
            continue;
        }
        ++it;
    }

    std::unique_ptr<aiNode> node(new aiNode(obj->id.name+2)); // skip over the name prefix 'OB'
    if (obj->data) {
        switch (obj->type)
        {
        case Object :: Type_EMPTY:
            break; // do nothing


            // supported object types
        case Object :: Type_MESH: {
            const size_t old = conv_data.meshes->size();

            CheckActualType(obj->data.get(),"Mesh");
            ConvertMesh(in,obj,static_cast<const Mesh*>(obj->data.get()),conv_data,conv_data.meshes);

            if (conv_data.meshes->size() > old) {
                node->mMeshes = new unsigned int[node->mNumMeshes = static_cast<unsigned int>(conv_data.meshes->size()-old)];
                for (unsigned int i = 0; i < node->mNumMeshes; ++i) {
                    node->mMeshes[i] = static_cast<unsigned int>(i + old);
                }
            }}
            break;
        case Object :: Type_LAMP: {
            CheckActualType(obj->data.get(),"Lamp");
            aiLight* mesh = ConvertLight(in,obj,static_cast<const Lamp*>(
                obj->data.get()),conv_data);

            if (mesh) {
                conv_data.lights->push_back(mesh);
            }}
            break;
        case Object :: Type_CAMERA: {
            CheckActualType(obj->data.get(),"Camera");
            aiCamera* mesh = ConvertCamera(in,obj,static_cast<const Camera*>(
                obj->data.get()),conv_data);

            if (mesh) {
                conv_data.cameras->push_back(mesh);
            }}
            break;


            // unsupported object types / log, but do not break
        case Object :: Type_CURVE:
            NotSupportedObjectType(obj,"Curve");
            break;
        case Object :: Type_SURF:
            NotSupportedObjectType(obj,"Surface");
            break;
        case Object :: Type_FONT:
            NotSupportedObjectType(obj,"Font");
            break;
        case Object :: Type_MBALL:
            NotSupportedObjectType(obj,"MetaBall");
            break;
        case Object :: Type_WAVE:
            NotSupportedObjectType(obj,"Wave");
            break;
        case Object :: Type_LATTICE:
            NotSupportedObjectType(obj,"Lattice");
            break;

            // invalid or unknown type
        default:
            break;
        }
    }

    for(unsigned int x = 0; x < 4; ++x) {
        for(unsigned int y = 0; y < 4; ++y) {
            node->mTransformation[y][x] = obj->obmat[x][y];
        }
    }

    aiMatrix4x4 m = parentTransform;
    m = m.Inverse();

    node->mTransformation = m*node->mTransformation;

    if (children.size()) {
        node->mNumChildren = static_cast<unsigned int>(children.size());
        aiNode** nd = node->mChildren = new aiNode*[node->mNumChildren]();
        for (const Object* nobj :children) {
            *nd = ConvertNode(in,nobj,conv_data,node->mTransformation * parentTransform);
            (*nd++)->mParent = node.get();
        }
    }

    // apply modifiers
    modifier_cache->ApplyModifiers(*node,conv_data,in,*obj);

    return node.release();
}